

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase52::run(TestCase52 *this)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  bool bVar4;
  StructReader reader;
  AlignedData<2> data;
  ulong local_80;
  StructReader local_78;
  PointerReader local_48;
  WirePointer local_28;
  undefined8 uStack_20;
  
  local_48.pointer = &local_28;
  local_28.offsetAndKind.value = 0;
  local_28.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x1;
  uStack_20 = 0xefcdab8967452301;
  local_48.segment = (SegmentReader *)0x0;
  local_48.capTable = (CapTableReader *)0x0;
  local_48.nestingLimit = 0x7fffffff;
  PointerReader::getStruct(&local_78,&local_48,(word *)0x0);
  bVar4 = true;
  if (0x3f < local_78.dataSize) {
    bVar4 = *local_78.data != 0xefcdab8967452301;
  }
  if ((bVar4) && (kj::_::Debug::minSeverity < 3)) {
    local_48.segment = (SegmentReader *)0xefcdab8967452301;
    if (local_78.dataSize < 0x40) {
      local_80 = 0;
    }
    else {
      local_80 = *local_78.data;
    }
    kj::_::Debug::log<char_const(&)[90],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x3e,ERROR,
               "\"failed: expected \" \"(0xefcdab8967452301ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS))\", 0xefcdab8967452301ull, reader.getDataField<uint64_t>(0 * ELEMENTS)"
               ,(char (*) [90])
                "failed: expected (0xefcdab8967452301ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS))"
               ,(unsigned_long_long *)&local_48,&local_80);
  }
  if (local_78.dataSize < 0x80) {
    bVar4 = false;
  }
  else {
    bVar4 = *(ulong *)((long)local_78.data + 8) != 0;
  }
  if ((bVar4) && (kj::_::Debug::minSeverity < 3)) {
    local_80 = local_80 & 0xffffffff00000000;
    if (local_78.dataSize < 0x80) {
      local_48.segment = (SegmentReader *)0x0;
    }
    else {
      local_48.segment = *(SegmentReader **)((long)local_78.data + 8);
    }
    kj::_::Debug::log<char_const(&)[71],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x3f,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getDataField<uint64_t>(1 * ELEMENTS))\", 0u, reader.getDataField<uint64_t>(1 * ELEMENTS)"
               ,(char (*) [71])
                "failed: expected (0u) == (reader.getDataField<uint64_t>(1 * ELEMENTS))",
               (uint *)&local_80,(unsigned_long *)&local_48);
  }
  bVar4 = true;
  if (0x1f < local_78.dataSize) {
    bVar4 = *local_78.data != 0x67452301;
  }
  if ((bVar4) && (kj::_::Debug::minSeverity < 3)) {
    uVar3 = 0;
    local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0x67452301);
    if (0x1f < local_78.dataSize) {
      uVar3 = *local_78.data;
    }
    local_80 = CONCAT44(local_80._4_4_,uVar3);
    kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x40,ERROR,
               "\"failed: expected \" \"(0x67452301u) == (reader.getDataField<uint32_t>(0 * ELEMENTS))\", 0x67452301u, reader.getDataField<uint32_t>(0 * ELEMENTS)"
               ,(char (*) [80])
                "failed: expected (0x67452301u) == (reader.getDataField<uint32_t>(0 * ELEMENTS))",
               (uint *)&local_48,(uint *)&local_80);
  }
  bVar4 = true;
  if (0x3f < local_78.dataSize) {
    bVar4 = *(uint *)((long)local_78.data + 4) != 0xefcdab89;
  }
  if ((bVar4) && (kj::_::Debug::minSeverity < 3)) {
    uVar3 = 0;
    local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0xefcdab89);
    if (0x3f < local_78.dataSize) {
      uVar3 = *(uint *)((long)local_78.data + 4);
    }
    local_80 = CONCAT44(local_80._4_4_,uVar3);
    kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x41,ERROR,
               "\"failed: expected \" \"(0xefcdab89u) == (reader.getDataField<uint32_t>(1 * ELEMENTS))\", 0xefcdab89u, reader.getDataField<uint32_t>(1 * ELEMENTS)"
               ,(char (*) [80])
                "failed: expected (0xefcdab89u) == (reader.getDataField<uint32_t>(1 * ELEMENTS))",
               (uint *)&local_48,(uint *)&local_80);
  }
  if (local_78.dataSize < 0x60) {
    bVar4 = false;
  }
  else {
    bVar4 = (uint)*(ulong *)((long)local_78.data + 8) != 0;
  }
  if ((bVar4) && (kj::_::Debug::minSeverity < 3)) {
    uVar3 = 0;
    local_48.segment = (SegmentReader *)((ulong)local_48.segment & 0xffffffff00000000);
    if (0x5f < local_78.dataSize) {
      uVar3 = (uint)*(ulong *)((long)local_78.data + 8);
    }
    local_80 = CONCAT44(local_80._4_4_,uVar3);
    kj::_::Debug::log<char_const(&)[71],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x42,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getDataField<uint32_t>(2 * ELEMENTS))\", 0u, reader.getDataField<uint32_t>(2 * ELEMENTS)"
               ,(char (*) [71])
                "failed: expected (0u) == (reader.getDataField<uint32_t>(2 * ELEMENTS))",
               (uint *)&local_48,(uint *)&local_80);
  }
  bVar4 = true;
  if (0xf < local_78.dataSize) {
    bVar4 = *local_78.data != 0x2301;
  }
  if ((bVar4) && (kj::_::Debug::minSeverity < 3)) {
    local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0x2301);
    if (local_78.dataSize < 0x10) {
      uVar2 = 0;
    }
    else {
      uVar2 = *local_78.data;
    }
    local_80 = CONCAT62(local_80._2_6_,uVar2);
    kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x43,ERROR,
               "\"failed: expected \" \"(0x2301u) == (reader.getDataField<uint16_t>(0 * ELEMENTS))\", 0x2301u, reader.getDataField<uint16_t>(0 * ELEMENTS)"
               ,(char (*) [76])
                "failed: expected (0x2301u) == (reader.getDataField<uint16_t>(0 * ELEMENTS))",
               (uint *)&local_48,(unsigned_short *)&local_80);
  }
  bVar4 = true;
  if (0x1f < local_78.dataSize) {
    bVar4 = *(ushort *)((long)local_78.data + 2) != 0x6745;
  }
  if ((bVar4) && (kj::_::Debug::minSeverity < 3)) {
    local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0x6745);
    if (local_78.dataSize < 0x20) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(ushort *)((long)local_78.data + 2);
    }
    local_80 = CONCAT62(local_80._2_6_,uVar2);
    kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x44,ERROR,
               "\"failed: expected \" \"(0x6745u) == (reader.getDataField<uint16_t>(1 * ELEMENTS))\", 0x6745u, reader.getDataField<uint16_t>(1 * ELEMENTS)"
               ,(char (*) [76])
                "failed: expected (0x6745u) == (reader.getDataField<uint16_t>(1 * ELEMENTS))",
               (uint *)&local_48,(unsigned_short *)&local_80);
  }
  bVar4 = true;
  if (0x2f < local_78.dataSize) {
    bVar4 = *(ushort *)((long)local_78.data + 4) != 0xab89;
  }
  if ((bVar4) && (kj::_::Debug::minSeverity < 3)) {
    local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0xab89);
    if (local_78.dataSize < 0x30) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(ushort *)((long)local_78.data + 4);
    }
    local_80 = CONCAT62(local_80._2_6_,uVar2);
    kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x45,ERROR,
               "\"failed: expected \" \"(0xab89u) == (reader.getDataField<uint16_t>(2 * ELEMENTS))\", 0xab89u, reader.getDataField<uint16_t>(2 * ELEMENTS)"
               ,(char (*) [76])
                "failed: expected (0xab89u) == (reader.getDataField<uint16_t>(2 * ELEMENTS))",
               (uint *)&local_48,(unsigned_short *)&local_80);
  }
  bVar4 = true;
  if (0x3f < local_78.dataSize) {
    bVar4 = *(ushort *)((long)local_78.data + 6) != 0xefcd;
  }
  if ((bVar4) && (kj::_::Debug::minSeverity < 3)) {
    local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0xefcd);
    if (local_78.dataSize < 0x40) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(ushort *)((long)local_78.data + 6);
    }
    local_80 = CONCAT62(local_80._2_6_,uVar2);
    kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x46,ERROR,
               "\"failed: expected \" \"(0xefcdu) == (reader.getDataField<uint16_t>(3 * ELEMENTS))\", 0xefcdu, reader.getDataField<uint16_t>(3 * ELEMENTS)"
               ,(char (*) [76])
                "failed: expected (0xefcdu) == (reader.getDataField<uint16_t>(3 * ELEMENTS))",
               (uint *)&local_48,(unsigned_short *)&local_80);
  }
  if (local_78.dataSize < 0x50) {
    bVar4 = false;
  }
  else {
    bVar4 = (ushort)*(ulong *)((long)local_78.data + 8) != 0;
  }
  if ((bVar4) && (kj::_::Debug::minSeverity < 3)) {
    local_48.segment = (SegmentReader *)((ulong)local_48.segment & 0xffffffff00000000);
    if (local_78.dataSize < 0x50) {
      uVar2 = 0;
    }
    else {
      uVar2 = (ushort)*(ulong *)((long)local_78.data + 8);
    }
    local_80 = CONCAT62(local_80._2_6_,uVar2);
    kj::_::Debug::log<char_const(&)[71],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x47,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getDataField<uint16_t>(4 * ELEMENTS))\", 0u, reader.getDataField<uint16_t>(4 * ELEMENTS)"
               ,(char (*) [71])
                "failed: expected (0u) == (reader.getDataField<uint16_t>(4 * ELEMENTS))",
               (uint *)&local_48,(unsigned_short *)&local_80);
  }
  bVar4 = true;
  if (0x3f < local_78.dataSize) {
    bVar4 = *local_78.data != 0xefcdab8967452301;
  }
  if ((bVar4) && (kj::_::Debug::minSeverity < 3)) {
    local_48.segment = (SegmentReader *)0xefcdab8967452240;
    local_80 = 0x141;
    if (0x3f < local_78.dataSize) {
      local_80 = *local_78.data ^ 0x141;
    }
    kj::_::Debug::log<char_const(&)[103],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x49,ERROR,
               "\"failed: expected \" \"(321u ^ 0xefcdab8967452301ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS, 321u))\", 321u ^ 0xefcdab8967452301ull, reader.getDataField<uint64_t>(0 * ELEMENTS, 321u)"
               ,(char (*) [103])
                "failed: expected (321u ^ 0xefcdab8967452301ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS, 321u))"
               ,(unsigned_long_long *)&local_48,&local_80);
  }
  bVar4 = true;
  if (0x1f < local_78.dataSize) {
    bVar4 = *local_78.data != 0x67452301;
  }
  if ((bVar4) && (kj::_::Debug::minSeverity < 3)) {
    local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0x67452240);
    uVar3 = 0x141;
    if (0x1f < local_78.dataSize) {
      uVar3 = *local_78.data ^ 0x141;
    }
    local_80 = CONCAT44(local_80._4_4_,uVar3);
    kj::_::Debug::log<char_const(&)[93],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x4a,ERROR,
               "\"failed: expected \" \"(321u ^ 0x67452301u) == (reader.getDataField<uint32_t>(0 * ELEMENTS, 321u))\", 321u ^ 0x67452301u, reader.getDataField<uint32_t>(0 * ELEMENTS, 321u)"
               ,(char (*) [93])
                "failed: expected (321u ^ 0x67452301u) == (reader.getDataField<uint32_t>(0 * ELEMENTS, 321u))"
               ,(uint *)&local_48,(uint *)&local_80);
  }
  bVar4 = true;
  if (0xf < local_78.dataSize) {
    bVar4 = *local_78.data != 0x2301;
  }
  if ((bVar4) && (kj::_::Debug::minSeverity < 3)) {
    local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0x2240);
    uVar2 = 0x141;
    if (0xf < local_78.dataSize) {
      uVar2 = *local_78.data ^ 0x141;
    }
    local_80 = CONCAT62(local_80._2_6_,uVar2);
    kj::_::Debug::log<char_const(&)[89],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x4b,ERROR,
               "\"failed: expected \" \"(321u ^ 0x2301u) == (reader.getDataField<uint16_t>(0 * ELEMENTS, 321u))\", 321u ^ 0x2301u, reader.getDataField<uint16_t>(0 * ELEMENTS, 321u)"
               ,(char (*) [89])
                "failed: expected (321u ^ 0x2301u) == (reader.getDataField<uint16_t>(0 * ELEMENTS, 321u))"
               ,(uint *)&local_48,(unsigned_short *)&local_80);
  }
  if (local_78.dataSize < 0x80) {
    bVar4 = false;
  }
  else {
    bVar4 = *(ulong *)((long)local_78.data + 8) != 0;
  }
  if ((bVar4) && (kj::_::Debug::minSeverity < 3)) {
    local_80 = CONCAT44(local_80._4_4_,0x141);
    local_48.segment = (SegmentReader *)0x141;
    if (0x7f < local_78.dataSize) {
      local_48.segment = (SegmentReader *)(*(ulong *)((long)local_78.data + 8) ^ 0x141);
    }
    kj::_::Debug::log<char_const(&)[79],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x4c,ERROR,
               "\"failed: expected \" \"(321u) == (reader.getDataField<uint64_t>(1 * ELEMENTS, 321u))\", 321u, reader.getDataField<uint64_t>(1 * ELEMENTS, 321u)"
               ,(char (*) [79])
                "failed: expected (321u) == (reader.getDataField<uint64_t>(1 * ELEMENTS, 321u))",
               (uint *)&local_80,(unsigned_long *)&local_48);
  }
  if (local_78.dataSize < 0x60) {
    bVar4 = false;
  }
  else {
    bVar4 = (uint)*(ulong *)((long)local_78.data + 8) != 0;
  }
  if ((bVar4) && (kj::_::Debug::minSeverity < 3)) {
    local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0x141);
    uVar3 = 0x141;
    if (0x5f < local_78.dataSize) {
      uVar3 = (uint)*(ulong *)((long)local_78.data + 8) ^ 0x141;
    }
    local_80 = CONCAT44(local_80._4_4_,uVar3);
    kj::_::Debug::log<char_const(&)[79],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x4d,ERROR,
               "\"failed: expected \" \"(321u) == (reader.getDataField<uint32_t>(2 * ELEMENTS, 321u))\", 321u, reader.getDataField<uint32_t>(2 * ELEMENTS, 321u)"
               ,(char (*) [79])
                "failed: expected (321u) == (reader.getDataField<uint32_t>(2 * ELEMENTS, 321u))",
               (uint *)&local_48,(uint *)&local_80);
  }
  if (local_78.dataSize < 0x50) {
    bVar4 = false;
  }
  else {
    bVar4 = (ushort)*(ulong *)((long)local_78.data + 8) != 0;
  }
  if ((bVar4) && (kj::_::Debug::minSeverity < 3)) {
    local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0x141);
    uVar2 = 0x141;
    if (0x4f < local_78.dataSize) {
      uVar2 = (ushort)*(ulong *)((long)local_78.data + 8) ^ 0x141;
    }
    local_80 = CONCAT62(local_80._2_6_,uVar2);
    kj::_::Debug::log<char_const(&)[79],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x4e,ERROR,
               "\"failed: expected \" \"(321u) == (reader.getDataField<uint16_t>(4 * ELEMENTS, 321u))\", 321u, reader.getDataField<uint16_t>(4 * ELEMENTS, 321u)"
               ,(char (*) [79])
                "failed: expected (321u) == (reader.getDataField<uint16_t>(4 * ELEMENTS, 321u))",
               (uint *)&local_48,(unsigned_short *)&local_80);
  }
  if (((local_78.dataSize == 0) || ((*local_78.data & 1) == 0)) && (kj::_::Debug::minSeverity < 3))
  {
    kj::_::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x51,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(0 * ELEMENTS)\"",
               (char (*) [57])"failed: expected reader.getDataField<bool>(0 * ELEMENTS)");
  }
  if (((1 < local_78.dataSize) && ((*local_78.data & 2) != 0)) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[60]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x52,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(1 * ELEMENTS))\"",
               (char (*) [60])"failed: expected !(reader.getDataField<bool>(1 * ELEMENTS))");
  }
  if (((2 < local_78.dataSize) && ((*local_78.data & 4) != 0)) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[60]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x53,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(2 * ELEMENTS))\"",
               (char (*) [60])"failed: expected !(reader.getDataField<bool>(2 * ELEMENTS))");
  }
  if (((3 < local_78.dataSize) && ((*local_78.data & 8) != 0)) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[60]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x54,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(3 * ELEMENTS))\"",
               (char (*) [60])"failed: expected !(reader.getDataField<bool>(3 * ELEMENTS))");
  }
  if (((4 < local_78.dataSize) && ((*local_78.data & 0x10) != 0)) && (kj::_::Debug::minSeverity < 3)
     ) {
    kj::_::Debug::log<char_const(&)[60]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x55,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(4 * ELEMENTS))\"",
               (char (*) [60])"failed: expected !(reader.getDataField<bool>(4 * ELEMENTS))");
  }
  if (((5 < local_78.dataSize) && ((*local_78.data & 0x20) != 0)) && (kj::_::Debug::minSeverity < 3)
     ) {
    kj::_::Debug::log<char_const(&)[60]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x56,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(5 * ELEMENTS))\"",
               (char (*) [60])"failed: expected !(reader.getDataField<bool>(5 * ELEMENTS))");
  }
  if (((6 < local_78.dataSize) && ((*local_78.data & 0x40) != 0)) && (kj::_::Debug::minSeverity < 3)
     ) {
    kj::_::Debug::log<char_const(&)[60]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x57,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(6 * ELEMENTS))\"",
               (char (*) [60])"failed: expected !(reader.getDataField<bool>(6 * ELEMENTS))");
  }
  if (((7 < local_78.dataSize) && ((char)*local_78.data < '\0')) && (kj::_::Debug::minSeverity < 3))
  {
    kj::_::Debug::log<char_const(&)[60]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x58,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(7 * ELEMENTS))\"",
               (char (*) [60])"failed: expected !(reader.getDataField<bool>(7 * ELEMENTS))");
  }
  if (((local_78.dataSize < 9) || ((*(byte *)((long)local_78.data + 1) & 1) == 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[58]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x5a,ERROR,"\"failed: expected \" \"reader.getDataField<bool>( 8 * ELEMENTS)\"",
               (char (*) [58])"failed: expected reader.getDataField<bool>( 8 * ELEMENTS)");
  }
  if (((local_78.dataSize < 10) || ((*(byte *)((long)local_78.data + 1) & 2) == 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[58]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x5b,ERROR,"\"failed: expected \" \"reader.getDataField<bool>( 9 * ELEMENTS)\"",
               (char (*) [58])"failed: expected reader.getDataField<bool>( 9 * ELEMENTS)");
  }
  if (((10 < local_78.dataSize) && ((*(byte *)((long)local_78.data + 1) & 4) != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x5c,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(10 * ELEMENTS))\"",
               (char (*) [61])"failed: expected !(reader.getDataField<bool>(10 * ELEMENTS))");
  }
  if (((0xb < local_78.dataSize) && ((*(byte *)((long)local_78.data + 1) & 8) != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x5d,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(11 * ELEMENTS))\"",
               (char (*) [61])"failed: expected !(reader.getDataField<bool>(11 * ELEMENTS))");
  }
  if (((0xc < local_78.dataSize) && ((*(byte *)((long)local_78.data + 1) & 0x10) != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x5e,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(12 * ELEMENTS))\"",
               (char (*) [61])"failed: expected !(reader.getDataField<bool>(12 * ELEMENTS))");
  }
  if (((local_78.dataSize < 0xe) || ((*(byte *)((long)local_78.data + 1) & 0x20) == 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[58]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x5f,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(13 * ELEMENTS)\"",
               (char (*) [58])"failed: expected reader.getDataField<bool>(13 * ELEMENTS)");
  }
  if (((0xe < local_78.dataSize) && ((*(byte *)((long)local_78.data + 1) & 0x40) != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x60,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(14 * ELEMENTS))\"",
               (char (*) [61])"failed: expected !(reader.getDataField<bool>(14 * ELEMENTS))");
  }
  if (((0xf < local_78.dataSize) && ((char)*(byte *)((long)local_78.data + 1) < '\0')) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x61,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(15 * ELEMENTS))\"",
               (char (*) [61])"failed: expected !(reader.getDataField<bool>(15 * ELEMENTS))");
  }
  if (((local_78.dataSize < 0x40) || (-1 < (char)*(byte *)((long)local_78.data + 7))) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[58]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,99,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(63 * ELEMENTS)\"",
               (char (*) [58])"failed: expected reader.getDataField<bool>(63 * ELEMENTS)");
  }
  if (((0x40 < local_78.dataSize) && ((*(ulong *)((long)local_78.data + 8) & 1) != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,100,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(64 * ELEMENTS))\"",
               (char (*) [61])"failed: expected !(reader.getDataField<bool>(64 * ELEMENTS))");
  }
  if (((local_78.dataSize == 0) || ((*local_78.data & 1) == 0)) && (kj::_::Debug::minSeverity < 3))
  {
    kj::_::Debug::log<char_const(&)[64]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x66,ERROR,
               "\"failed: expected \" \"reader.getDataField<bool>(0 * ELEMENTS, false)\"",
               (char (*) [64])"failed: expected reader.getDataField<bool>(0 * ELEMENTS, false)");
  }
  if (((1 < local_78.dataSize) && ((*local_78.data & 2) != 0)) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[67]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x67,ERROR,
               "\"failed: expected \" \"!(reader.getDataField<bool>(1 * ELEMENTS, false))\"",
               (char (*) [67])"failed: expected !(reader.getDataField<bool>(1 * ELEMENTS, false))");
  }
  if (((local_78.dataSize < 0x40) || (-1 < (char)*(byte *)((long)local_78.data + 7))) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[65]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x68,ERROR,
               "\"failed: expected \" \"reader.getDataField<bool>(63 * ELEMENTS, false)\"",
               (char (*) [65])"failed: expected reader.getDataField<bool>(63 * ELEMENTS, false)");
  }
  if (((0x40 < local_78.dataSize) && ((*(ulong *)((long)local_78.data + 8) & 1) != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[68]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x69,ERROR,
               "\"failed: expected \" \"!(reader.getDataField<bool>(64 * ELEMENTS, false))\"",
               (char (*) [68])"failed: expected !(reader.getDataField<bool>(64 * ELEMENTS, false))")
    ;
  }
  if (local_78.dataSize == 0) {
    bVar4 = true;
  }
  else {
    bVar4 = (*local_78.data & 1) == 0;
  }
  if ((bVar4) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[66]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x6a,ERROR,
               "\"failed: expected \" \"!(reader.getDataField<bool>(0 * ELEMENTS, true))\"",
               (char (*) [66])"failed: expected !(reader.getDataField<bool>(0 * ELEMENTS, true))");
  }
  if (local_78.dataSize < 2) {
    bVar1 = 0;
  }
  else {
    bVar1 = (*local_78.data & 2) >> 1;
  }
  if ((bVar1 != 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[63]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x6b,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(1 * ELEMENTS, true)\""
               ,(char (*) [63])"failed: expected reader.getDataField<bool>(1 * ELEMENTS, true)");
  }
  bVar4 = true;
  if (0x3f < local_78.dataSize) {
    bVar4 = -1 < (char)*(byte *)((long)local_78.data + 7);
  }
  if ((bVar4) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[67]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x6c,ERROR,
               "\"failed: expected \" \"!(reader.getDataField<bool>(63 * ELEMENTS, true))\"",
               (char (*) [67])"failed: expected !(reader.getDataField<bool>(63 * ELEMENTS, true))");
  }
  if (local_78.dataSize < 0x41) {
    bVar1 = 0;
  }
  else {
    bVar1 = (byte)*(ulong *)((long)local_78.data + 8) & 1;
  }
  if ((bVar1 != 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[64]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x6d,ERROR,
               "\"failed: expected \" \"reader.getDataField<bool>(64 * ELEMENTS, true)\"",
               (char (*) [64])"failed: expected reader.getDataField<bool>(64 * ELEMENTS, true)");
  }
  return;
}

Assistant:

TEST(WireFormat, SimpleRawDataStruct) {
  AlignedData<2> data = {{
    // Struct ref, offset = 1, dataSize = 1, pointerCount = 0
    0x00, 0x00, 0x00, 0x00, 0x01, 0x00, 0x00, 0x00,
    // Content for the data section.
    0x01, 0x23, 0x45, 0x67, 0x89, 0xab, 0xcd, 0xef
  }};

  StructReader reader = PointerReader::getRootUnchecked(data.words).getStruct(nullptr);

  EXPECT_EQ(0xefcdab8967452301ull, reader.getDataField<uint64_t>(0 * ELEMENTS));
  EXPECT_EQ(0u, reader.getDataField<uint64_t>(1 * ELEMENTS));
  EXPECT_EQ(0x67452301u, reader.getDataField<uint32_t>(0 * ELEMENTS));
  EXPECT_EQ(0xefcdab89u, reader.getDataField<uint32_t>(1 * ELEMENTS));
  EXPECT_EQ(0u, reader.getDataField<uint32_t>(2 * ELEMENTS));
  EXPECT_EQ(0x2301u, reader.getDataField<uint16_t>(0 * ELEMENTS));
  EXPECT_EQ(0x6745u, reader.getDataField<uint16_t>(1 * ELEMENTS));
  EXPECT_EQ(0xab89u, reader.getDataField<uint16_t>(2 * ELEMENTS));
  EXPECT_EQ(0xefcdu, reader.getDataField<uint16_t>(3 * ELEMENTS));
  EXPECT_EQ(0u, reader.getDataField<uint16_t>(4 * ELEMENTS));

  EXPECT_EQ(321u ^ 0xefcdab8967452301ull, reader.getDataField<uint64_t>(0 * ELEMENTS, 321u));
  EXPECT_EQ(321u ^ 0x67452301u, reader.getDataField<uint32_t>(0 * ELEMENTS, 321u));
  EXPECT_EQ(321u ^ 0x2301u, reader.getDataField<uint16_t>(0 * ELEMENTS, 321u));
  EXPECT_EQ(321u, reader.getDataField<uint64_t>(1 * ELEMENTS, 321u));
  EXPECT_EQ(321u, reader.getDataField<uint32_t>(2 * ELEMENTS, 321u));
  EXPECT_EQ(321u, reader.getDataField<uint16_t>(4 * ELEMENTS, 321u));

  // Bits
  EXPECT_TRUE (reader.getDataField<bool>(0 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(1 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(2 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(3 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(4 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(5 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(6 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(7 * ELEMENTS));

  EXPECT_TRUE (reader.getDataField<bool>( 8 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>( 9 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(10 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(11 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(12 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(13 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(14 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(15 * ELEMENTS));

  EXPECT_TRUE (reader.getDataField<bool>(63 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(64 * ELEMENTS));

  EXPECT_TRUE (reader.getDataField<bool>(0 * ELEMENTS, false));
  EXPECT_FALSE(reader.getDataField<bool>(1 * ELEMENTS, false));
  EXPECT_TRUE (reader.getDataField<bool>(63 * ELEMENTS, false));
  EXPECT_FALSE(reader.getDataField<bool>(64 * ELEMENTS, false));
  EXPECT_FALSE(reader.getDataField<bool>(0 * ELEMENTS, true));
  EXPECT_TRUE (reader.getDataField<bool>(1 * ELEMENTS, true));
  EXPECT_FALSE(reader.getDataField<bool>(63 * ELEMENTS, true));
  EXPECT_TRUE (reader.getDataField<bool>(64 * ELEMENTS, true));
}